

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::queryReplaceOrder(Application *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Application *this_00;
  Message replace;
  allocator<char> local_2c1;
  OrderCancelReplaceRequest local_2c0;
  Message local_168 [344];
  
  iVar2 = queryVersion(this);
  std::operator<<((ostream *)&std::cout,"\nCancelReplaceRequest\n");
  FIX::Message::Message(local_168);
  switch(iVar2) {
  case 0x28:
    queryCancelReplaceRequest40(&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x29:
    queryCancelReplaceRequest41((OrderCancelReplaceRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x2a:
    queryCancelReplaceRequest42((OrderCancelReplaceRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x2b:
    queryCancelReplaceRequest43((OrderCancelReplaceRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x2c:
    queryCancelReplaceRequest44((OrderCancelReplaceRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"No test for version ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    goto LAB_0011aec9;
  case 0x32:
    queryCancelReplaceRequest50((OrderCancelReplaceRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  FIX::Message::~Message((Message *)&local_2c0);
LAB_0011aec9:
  this_00 = (Application *)&local_2c0;
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"Send replace",&local_2c1);
  bVar1 = queryConfirm(this_00,(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
    FIX::Session::sendToTarget(local_168,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

void Application::queryReplaceOrder() {
  int version = queryVersion();
  std::cout << "\nCancelReplaceRequest\n";
  FIX::Message replace;

  switch (version) {
  case 40:
    replace = queryCancelReplaceRequest40();
    break;
  case 41:
    replace = queryCancelReplaceRequest41();
    break;
  case 42:
    replace = queryCancelReplaceRequest42();
    break;
  case 43:
    replace = queryCancelReplaceRequest43();
    break;
  case 44:
    replace = queryCancelReplaceRequest44();
    break;
  case 50:
    replace = queryCancelReplaceRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send replace")) {
    FIX::Session::sendToTarget(replace);
  }
}